

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementShellANCF_3423::ComputeGravityForceScale(ChElementShellANCF_3423 *this)

{
  double dVar1;
  pointer pdVar2;
  ulong uVar3;
  long lVar4;
  double rho;
  ShellANCF_Gravity myformula;
  VectorN Fgravity;
  double local_118;
  ChIntegrable3D<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> local_110;
  ChElementShellANCF_3423 *local_108;
  __shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> local_100 [6];
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>
  local_a0 [2];
  
  Eigen::DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>::setZero
            ((DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> *)&this->m_GravForceScale);
  lVar4 = 8;
  for (uVar3 = 0; uVar3 < this->m_numLayers; uVar3 = uVar3 + 1) {
    std::__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (local_100,
               (__shared_ptr<chrono::fea::ChMaterialShellANCF,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&(((this->m_layers).
                         super__Vector_base<chrono::fea::ChElementShellANCF_3423::Layer,_Eigen::aligned_allocator<chrono::fea::ChElementShellANCF_3423::Layer>_>
                         ._M_impl.super__Vector_impl_data._M_start)->m_T0).
                       super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage +
               lVar4 + -0x40));
    dVar1 = (local_100[0]._M_ptr)->m_rho;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_100[0]._M_refcount);
    local_110._vptr_ChIntegrable3D = (_func_int **)&PTR__ChIntegrable3D_01183640;
    local_118 = dVar1;
    local_108 = this;
    Eigen::DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_>::setZero
              ((DenseBase<Eigen::Matrix<double,_8,_1,_0,_8,_1>_> *)local_100);
    pdVar2 = (this->m_GaussZ).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    ChQuadrature::Integrate3D<Eigen::Matrix<double,8,1,0,8,1>>
              ((Matrix<double,_8,_1,_0,_8,_1> *)local_100,&local_110,-1.0,1.0,-1.0,1.0,pdVar2[uVar3]
               ,pdVar2[uVar3 + 1],2);
    Eigen::operator*(local_a0,&local_118,(StorageBaseType *)local_100);
    Eigen::MatrixBase<Eigen::Matrix<double,8,1,0,8,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,8,1,0,8,1>> *)&this->m_GravForceScale,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>,_const_Eigen::Matrix<double,_8,_1,_0,_8,_1>_>_>
                *)local_a0);
    lVar4 = lVar4 + 0x160;
  }
  return;
}

Assistant:

void ChElementShellANCF_3423::ComputeGravityForceScale() {
    m_GravForceScale.setZero();

    for (size_t kl = 0; kl < m_numLayers; kl++) {
        double rho = m_layers[kl].GetMaterial()->Get_rho();
        ShellANCF_Gravity myformula(this);
        VectorN Fgravity;
        Fgravity.setZero();
        ChQuadrature::Integrate3D<VectorN>(Fgravity,                        // result of integration will go there
                                           myformula,                       // formula to integrate
                                           -1, 1,                           // x limits
                                           -1, 1,                           // y limits
                                           m_GaussZ[kl], m_GaussZ[kl + 1],  // z limits
                                           2                                // order of integration
        );

        m_GravForceScale += rho * Fgravity;
    }
}